

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_36::HttpChunkedEntityWriter::write
          (HttpChunkedEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined8 *puVar1;
  HttpEntityBodyWriter *this_00;
  undefined8 uVar2;
  PromiseBase PVar3;
  ArrayPtr<const_char> *pAVar4;
  size_t sVar5;
  long lVar6;
  PromiseNode *pPVar7;
  ArrayPtr<const_unsigned_char> *pAVar8;
  long lVar9;
  PromiseArena *pPVar10;
  PromiseNode *pPVar11;
  undefined4 in_register_00000034;
  unsigned_long i;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces;
  Promise<void> promise;
  Array<kj::ArrayPtr<const_unsigned_char>_> parts;
  String header;
  undefined1 local_a8 [16];
  PromiseBase local_98;
  ArrayPtr<const_char> *pAStack_90;
  undefined8 *local_88;
  Array<kj::ArrayPtr<const_unsigned_char>_> local_78;
  undefined1 local_58 [16];
  char local_48 [8];
  undefined8 *local_40;
  
  if (__n != 0) {
    lVar6 = 0;
    i = 0;
    do {
      i = i + *(long *)((long)__buf + lVar6 + 8);
      lVar6 = lVar6 + 0x10;
    } while (__n << 4 != lVar6);
    if (i != 0) {
      hex((CappedArray<char,_17UL> *)local_58,i);
      local_98.node.ptr = (OwnPromiseNode)(local_58 + 8);
      pAStack_90 = (ArrayPtr<const_char> *)local_58._0_8_;
      local_a8._0_8_ =
           (long)"POST /foo HTTP/1.1\r\nTransfer-Encoding: chunked\r\n\r\n0\r\n\r\n" + 0x35;
      local_a8._8_8_ = (AsyncOutputStream *)0x2;
      kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((String *)&local_78,(_ *)&local_98,(ArrayPtr<const_char> *)local_a8,
                 (ArrayPtr<const_char> *)local_58._0_8_);
      pPVar7 = (PromiseNode *)
               kj::_::HeapArrayDisposer::allocateImpl
                         (0x10,0,__n + 2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      pAVar8 = (ArrayPtr<const_unsigned_char> *)local_78.size_;
      if ((ArrayPtr<const_unsigned_char> *)local_78.size_ != (ArrayPtr<const_unsigned_char> *)0x0) {
        pAVar8 = local_78.ptr;
      }
      pPVar10 = (PromiseArena *)0x0;
      if ((ArrayPtr<const_unsigned_char> *)local_78.size_ != (ArrayPtr<const_unsigned_char> *)0x0) {
        pPVar10 = (PromiseArena *)
                  ((long)&((ArrayPtr<const_unsigned_char> *)(local_78.size_ + -0x10))->size_ + 7);
      }
      local_40 = &kj::_::HeapArrayDisposer::instance;
      pPVar11 = pPVar7 + 1;
      (pPVar7->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)pAVar8;
      (pPVar7->super_PromiseArenaMember).arena = pPVar10;
      if (__n != 0) {
        lVar6 = 0;
        do {
          lVar9 = lVar6;
          uVar2 = ((undefined8 *)((long)__buf + lVar9))[1];
          puVar1 = (undefined8 *)
                   ((long)&(pPVar11->super_PromiseArenaMember)._vptr_PromiseArenaMember + lVar9);
          *puVar1 = *(undefined8 *)((long)__buf + lVar9);
          puVar1[1] = uVar2;
          lVar6 = lVar9 + 0x10;
        } while (__n << 4 != lVar9 + 0x10);
        pPVar11 = (PromiseNode *)
                  ((long)&pPVar11[1].super_PromiseArenaMember._vptr_PromiseArenaMember + lVar9);
      }
      (pPVar11->super_PromiseArenaMember)._vptr_PromiseArenaMember =
           (_func_int **)&kj::_::ByteLiteral<3ul>;
      (pPVar11->super_PromiseArenaMember).arena = (PromiseArena *)0x2;
      pAStack_90 = (ArrayPtr<const_char> *)((long)pPVar11 + (0x10 - (long)pPVar7) >> 4);
      local_88 = &kj::_::HeapArrayDisposer::instance;
      local_58._0_8_ = 0;
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      local_48[0] = '\0';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      this_00 = *(HttpEntityBodyWriter **)(CONCAT44(in_register_00000034,__fd) + 8);
      local_98.node.ptr = (OwnPromiseNode)(OwnPromiseNode)pPVar7;
      HttpEntityBodyWriter::getInner(this_00);
      pieces.size_ = (size_t)pPVar7;
      pieces.ptr = (ArrayPtr<const_unsigned_char> *)this_00;
      HttpOutputStream::writeBodyData((HttpOutputStream *)local_a8,pieces);
      Promise<void>::attach<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>
                ((Promise<void> *)this,(String *)local_a8,&local_78);
      uVar2 = local_a8._0_8_;
      if ((Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)local_a8._0_8_ !=
          (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0) {
        local_a8._0_8_ = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
      }
      pAVar4 = pAStack_90;
      PVar3.node.ptr = local_98.node.ptr;
      if (local_98.node.ptr != (PromiseNode *)0x0) {
        local_98.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
        pAStack_90 = (ArrayPtr<const_char> *)0x0;
        (**(code **)*local_88)(local_88,PVar3.node.ptr,0x10,pAVar4,pAVar4,0);
      }
      sVar5 = local_78.size_;
      pAVar8 = local_78.ptr;
      if (local_78.ptr == (ArrayPtr<const_unsigned_char> *)0x0) {
        return (ssize_t)this;
      }
      local_78.ptr = (ArrayPtr<const_unsigned_char> *)0x0;
      local_78.size_ = 0;
      (**(local_78.disposer)->_vptr_ArrayDisposer)(local_78.disposer,pAVar8,1,sVar5,sVar5,0);
      return (ssize_t)this;
    }
  }
  kj::_::readyNow();
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    uint64_t size = 0;
    for (auto& piece: pieces) size += piece.size();

    if (size == 0) return kj::READY_NOW;  // can't encode zero-size chunk since it indicates EOF.

    auto header = kj::str(kj::hex(size), "\r\n");
    auto partsBuilder = kj::heapArrayBuilder<ArrayPtr<const byte>>(pieces.size() + 2);
    partsBuilder.add(header.asBytes());
    for (auto& piece: pieces) {
      partsBuilder.add(piece);
    }
    partsBuilder.add("\r\n"_kjb);

    auto parts = partsBuilder.finish();
    auto promise = getInner().writeBodyData(parts.asPtr());
    return promise.attach(kj::mv(header), kj::mv(parts));
  }